

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_input.cpp
# Opt level: O0

void Am_Drawonable::Process_Event(Am_Time *deadline)

{
  bool bVar1;
  int iVar2;
  Am_Wrapper *value;
  Am_Time_Data *this;
  Am_Time_Data *time_data;
  Am_Time local_e0;
  Am_Time timeout;
  Am_Time now;
  XEvent event_return;
  Am_Time *deadline_local;
  
  now.data._0_4_ = 0;
  bVar1 = Am_Time::Zero(deadline);
  if (bVar1) {
    Screen_Manager::Next_Event(&Scrn_Mgr,(XEvent *)&now,(timeval *)0x0);
  }
  else {
    Am_Time::Now();
    Am_Time::Am_Time(&local_e0);
    bVar1 = Am_Time::operator>(deadline,&timeout);
    if (bVar1) {
      Am_Time::operator-((Am_Time *)&time_data,deadline);
      Am_Time::operator=(&local_e0,(Am_Time *)&time_data);
      Am_Time::~Am_Time((Am_Time *)&time_data);
    }
    value = Am_Time::operator_cast_to_Am_Wrapper_(&local_e0);
    this = Am_Time_Data::Narrow(value);
    Screen_Manager::Next_Event(&Scrn_Mgr,(XEvent *)&now,&this->time);
    Am_Wrapper::Release(&this->super_Am_Wrapper);
    bVar1 = (int)now.data == 0;
    Am_Time::~Am_Time(&local_e0);
    Am_Time::~Am_Time(&timeout);
    if (bVar1) {
      return;
    }
  }
  Disp_Flush_Extra_Move_Events((XEvent *)&now);
  Am_Handle_Event_Received((XEvent *)&now);
  bVar1 = Am_Time::Is_Past(deadline);
  if (!bVar1) {
    iVar2 = is_input_event((XEvent *)&now);
    if (iVar2 == 0) {
      do {
        bVar1 = Screen_Manager::Pending(&Scrn_Mgr,(XEvent *)&now);
        if (!bVar1) goto LAB_0037c96d;
        Am_Handle_Event_Received((XEvent *)&now);
        iVar2 = is_input_event((XEvent *)&now);
        if (iVar2 != 0) goto LAB_0037c96d;
        bVar1 = Am_Time::Is_Past(deadline);
      } while (!bVar1);
    }
    else {
LAB_0037c96d:
      do {
        bVar1 = Screen_Manager::Pending(&Scrn_Mgr,(XEvent *)&now);
        if (!bVar1) {
          return;
        }
        iVar2 = is_input_event((XEvent *)&now);
        if (iVar2 != 0) {
          Screen_Manager::Put_Event_Back(&Scrn_Mgr,(XEvent *)&now);
          return;
        }
        Am_Handle_Event_Received((XEvent *)&now);
        bVar1 = Am_Time::Is_Past(deadline);
      } while (!bVar1);
    }
  }
  return;
}

Assistant:

void
Am_Drawonable::Process_Event(const Am_Time &deadline)
{
  XEvent event_return;

  // jh6p Oct 97 : XWindows calls interfere with network hooks
  // Don't use XPending. It bypasses our network select.
  // Use Screen_Manager::Pending and Screen_Manager::Block.
  // Therefore it is like always having multiple displays, since
  // we didn't use XPending for multiple displays.
  //
  // See also: Process_Event

  event_return.type = 0;

  // If there is no deadline then we will wait forever, if necessary, for
  // the next event. Otherwise we will only wait up till the deadline.
  if (deadline.Zero())
    Scrn_Mgr.Next_Event(&event_return, static_cast<timeval *>(nullptr));
  else {
    // Figure out when we stop processing
    Am_Time now = Am_Time::Now();
    Am_Time timeout;
    if (deadline > now)
      timeout = deadline - now;

    Am_Time_Data *time_data = Am_Time_Data::Narrow(timeout);

    // Only wait as long as the timeout
    Scrn_Mgr.Next_Event(&event_return, &time_data->time);

    time_data->Release();

    // doesn't always return appn event: could time out.
    if (!event_return.type)
      return; // we timed out.
  }

  Disp_Flush_Extra_Move_Events(event_return);
  Am_Handle_Event_Received(event_return);

  if (deadline.Is_Past())
    return;

  // If that was not an input event, then process all the remaining
  // non-input events until we have processed an input event.
  if (!is_input_event(event_return)) {
    while (Scrn_Mgr.Pending(&event_return)) {
      Am_Handle_Event_Received(event_return);

      if (is_input_event(event_return))
        break;

      if (deadline.Is_Past())
        return;
    }
  }

  // Process all remaining non-input events
  while (Scrn_Mgr.Pending(&event_return)) {
    if (is_input_event(event_return)) {
      Scrn_Mgr.Put_Event_Back(event_return);
      return;
    } else
      Am_Handle_Event_Received(event_return);

    if (deadline.Is_Past())
      return;
  }
}